

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_band.c
# Opt level: O0

SUNErrCode SUNMatZero_Band(SUNMatrix A)

{
  long lVar1;
  sunrealtype *Adata;
  sunindextype i;
  SUNContext sunctx_local_scope_;
  SUNMatrix A_local;
  
  lVar1 = *(long *)((long)A->content + 0x30);
  for (i = 0; i < *(long *)((long)A->content + 0x38); i = i + 1) {
    *(undefined8 *)(lVar1 + i * 8) = 0;
  }
  return 0;
}

Assistant:

SUNErrCode SUNMatZero_Band(SUNMatrix A)
{
  SUNFunctionBegin(A->sunctx);
  sunindextype i;
  sunrealtype* Adata;

  SUNAssert(SUNMatGetID(A) == SUNMATRIX_BAND, SUN_ERR_ARG_WRONGTYPE);

  /* Perform operation */
  Adata = SM_DATA_B(A);
  for (i = 0; i < SM_LDATA_B(A); i++) { Adata[i] = ZERO; }

  return SUN_SUCCESS;
}